

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O3

void double_suite::test_alternating(void)

{
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  close_to<double> predicate_11;
  close_to<double> predicate_12;
  close_to<double> predicate_13;
  close_to<double> predicate_14;
  close_to<double> predicate_15;
  close_to<double> predicate_16;
  close_to<double> predicate_17;
  close_to<double> predicate_18;
  close_to<double> predicate_19;
  close_to<double> predicate_20;
  close_to<double> predicate_21;
  close_to<double> predicate_22;
  close_to<double> predicate_23;
  close_to<double> predicate_24;
  close_to<double> predicate_25;
  close_to<double> predicate_26;
  close_to<double> predicate_27;
  close_to<double> predicate_28;
  close_to<double> predicate_29;
  close_to<double> predicate_30;
  close_to<double> predicate_31;
  close_to<double> predicate_32;
  close_to<double> predicate_33;
  close_to<double> predicate_34;
  close_to<double> predicate_35;
  close_to<double> predicate_36;
  double *in_stack_ffffffffffffffb8;
  double local_40;
  char local_38 [8];
  
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = -0x10;
  local_38[7] = '?';
  local_40 = 1.0;
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x7e,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate);
  local_38[0] = '\0';
  local_38[1] = '\0';
  local_38[2] = '\0';
  local_38[3] = '\0';
  local_38[4] = '\0';
  local_38[5] = '\0';
  local_38[6] = '\0';
  local_38[7] = '@';
  local_40 = 2.0;
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","2.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x80,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_00);
  local_38[0] = -0x39;
  local_38[1] = 'q';
  local_38[2] = '\x1c';
  local_38[3] = -0x39;
  local_38[4] = 'q';
  local_38[5] = '\x1c';
  local_38[6] = -9;
  local_38[7] = '?';
  local_40 = 1.44444;
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.44444","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x82,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_01);
  local_38[0] = 'V';
  local_38[1] = 'U';
  local_38[2] = 'U';
  local_38[3] = 'U';
  local_38[4] = 'U';
  local_38[5] = 'U';
  local_38[6] = -3;
  local_38[7] = '?';
  local_40 = 1.83333;
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.83333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x84,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_02);
  local_38[0] = '\x1a';
  local_38[1] = -0x18;
  local_38[2] = -0x4c;
  local_38[3] = -0x7f;
  local_38[4] = 'N';
  local_38[5] = '\x1b';
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.50667;
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.50667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x86,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_03);
  local_38[0] = 'l';
  local_38[1] = -0x3f;
  local_38[2] = '\x16';
  local_38[3] = 'l';
  local_38[4] = -0x3f;
  local_38[5] = '\x16';
  local_38[6] = -4;
  local_38[7] = '?';
  local_40 = 1.75556;
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.75556","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x88,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_04);
  local_38[0] = 'M';
  local_38[1] = '=';
  local_38[2] = -0x50;
  local_38[3] = -0x46;
  local_38[4] = '\x18';
  local_38[5] = 'g';
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.52517;
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.52517","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x8a,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_05);
  local_38[0] = -0x5c;
  local_38[1] = '5';
  local_38[2] = 'Z';
  local_38[3] = -0x5d;
  local_38[4] = '5';
  local_38[5] = 'Z';
  local_38[6] = -5;
  local_38[7] = '?';
  local_40 = 1.70952;
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.70952","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x8c,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_06);
  local_38[0] = -0x29;
  local_38[1] = '2';
  local_38[2] = -0x61;
  local_38[3] = '\x0f';
  local_38[4] = -0x3f;
  local_38[5] = -0x7e;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53192;
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53192","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x8e,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_07);
  local_38[0] = -0xc;
  local_38[1] = -0x20;
  local_38[2] = -0x58;
  local_38[3] = '\'';
  local_38[4] = '\x14';
  local_38[5] = -0x24;
  local_38[6] = -6;
  local_38[7] = '?';
  local_40 = 1.67873;
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.67873","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x90,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_08);
  local_38[0] = -0x74;
  local_38[1] = -0x21;
  local_38[2] = -0x61;
  local_38[3] = -9;
  local_38[4] = -0x2c;
  local_38[5] = -0x74;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53438;
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53438","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x92,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_09);
  local_38[0] = '@';
  local_38[1] = -0x1e;
  local_38[2] = -0x59;
  local_38[3] = -0x73;
  local_38[4] = '\x18';
  local_38[5] = -0x7f;
  local_38[6] = -6;
  local_38[7] = '?';
  local_40 = 1.65652;
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.65652","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x94,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_10);
  local_38[0] = 'G';
  local_38[1] = -0x69;
  local_38[2] = -0x26;
  local_38[3] = -0xe;
  local_38[4] = 'f';
  local_38[5] = -0x71;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53501;
  predicate_11.absolute = 2.2250738585072014e-308;
  predicate_11.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53501","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x96,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_11);
  local_38[0] = -0x18;
  local_38[1] = 'g';
  local_38[2] = -0x5a;
  local_38[3] = '*';
  local_38[4] = '\x04';
  local_38[5] = '<';
  local_38[6] = -6;
  local_38[7] = '?';
  local_40 = 1.63965;
  predicate_12.absolute = 2.2250738585072014e-308;
  predicate_12.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.63965","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x98,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_12);
  local_38[0] = -0x27;
  local_38[1] = '\x1d';
  local_38[2] = 'G';
  local_38[3] = '~';
  local_38[4] = '|';
  local_38[5] = -0x72;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53479;
  predicate_13.absolute = 2.2250738585072014e-308;
  predicate_13.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53479","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x9a,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_13);
  local_38[0] = -4;
  local_38[1] = -0x55;
  local_38[2] = 'b';
  local_38[3] = -0x4a;
  local_38[4] = -0x6c;
  local_38[5] = '\x05';
  local_38[6] = -6;
  local_38[7] = '?';
  local_40 = 1.62636;
  predicate_14.absolute = 2.2250738585072014e-308;
  predicate_14.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.62636","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x9c,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_14);
  local_38[0] = -0x7c;
  local_38[1] = '(';
  local_38[2] = -0x77;
  local_38[3] = 'n';
  local_38[4] = -0x1b;
  local_38[5] = -0x75;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53415;
  predicate_15.absolute = 2.2250738585072014e-308;
  predicate_15.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53415","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0x9e,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_15);
  local_38[0] = 'B';
  local_38[1] = -0x5a;
  local_38[2] = 'H';
  local_38[3] = '!';
  local_38[4] = 'u';
  local_38[5] = -0x27;
  local_38[6] = -7;
  local_38[7] = '?';
  local_40 = 1.61559;
  predicate_16.absolute = 2.2250738585072014e-308;
  predicate_16.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.61559","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xa0,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_16);
  local_38[0] = -0x6b;
  local_38[1] = -0x1f;
  local_38[2] = 'P';
  local_38[3] = '=';
  local_38[4] = -0x7c;
  local_38[5] = -0x78;
  local_38[6] = -8;
  local_38[7] = '?';
  local_40 = 1.53333;
  predicate_17.absolute = 2.2250738585072014e-308;
  predicate_17.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.53333","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xa2,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_17);
  local_38[0] = 'N';
  local_38[1] = -0x2a;
  local_38[2] = '\f';
  local_38[3] = '\a';
  local_38[4] = -0x1c;
  local_38[5] = -0x4c;
  local_38[6] = -7;
  local_38[7] = '?';
  local_40 = 1.60666;
  predicate_18.absolute = 2.2250738585072014e-308;
  predicate_18.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","1.60666","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xa4,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_18);
  local_38[0] = -0x5e;
  local_38[1] = 'H';
  local_38[2] = 'M';
  local_38[3] = 'B';
  local_38[4] = -0x16;
  local_38[5] = 'v';
  local_38[6] = 'a';
  local_38[7] = '@';
  local_40 = 139.716;
  predicate_19.absolute = 2.2250738585072014e-308;
  predicate_19.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","139.716","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xa9,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_19);
  local_38[0] = '\a';
  local_38[1] = -0x2e;
  local_38[2] = -0x6d;
  local_38[3] = -0x3c;
  local_38[4] = -0xc;
  local_38[5] = '+';
  local_38[6] = '`';
  local_38[7] = '@';
  local_40 = 129.374;
  predicate_20.absolute = 2.2250738585072014e-308;
  predicate_20.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","129.374","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xae,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_20);
  local_38[0] = 'W';
  local_38[1] = -0x7f;
  local_38[2] = '_';
  local_38[3] = '#';
  local_38[4] = 'P';
  local_38[5] = -2;
  local_38[6] = ']';
  local_38[7] = '@';
  local_40 = 119.974;
  predicate_21.absolute = 2.2250738585072014e-308;
  predicate_21.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","119.974","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb0,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_21);
  local_38[0] = 'H';
  local_38[1] = '1';
  local_38[2] = -0x1a;
  local_38[3] = '!';
  local_38[4] = 'b';
  local_38[5] = -0x18;
  local_38[6] = '[';
  local_38[7] = '@';
  local_40 = 111.631;
  predicate_22.absolute = 2.2250738585072014e-308;
  predicate_22.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","111.631","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb2,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_22);
  local_38[0] = 'r';
  local_38[1] = -0x43;
  local_38[2] = -0x7b;
  local_38[3] = '}';
  local_38[4] = '\x1d';
  local_38[5] = -2;
  local_38[6] = 'Y';
  local_38[7] = '@';
  local_40 = 103.971;
  predicate_23.absolute = 2.2250738585072014e-308;
  predicate_23.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","103.971","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb4,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_23);
  local_38[0] = '.';
  local_38[1] = -0x2e;
  local_38[2] = 'J';
  local_38[3] = -100;
  local_38[4] = 'i';
  local_38[5] = 'H';
  local_38[6] = 'X';
  local_38[7] = '@';
  local_40 = 97.1314;
  predicate_24.absolute = 2.2250738585072014e-308;
  predicate_24.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","97.1314","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb6,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_24);
  local_38[0] = 'T';
  local_38[1] = 'L';
  local_38[2] = '\v';
  local_38[3] = -3;
  local_38[4] = -0x26;
  local_38[5] = -0x4e;
  local_38[6] = 'V';
  local_38[7] = '@';
  local_40 = 90.7946;
  predicate_25.absolute = 2.2250738585072014e-308;
  predicate_25.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","90.7946","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xb8,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_25);
  local_38[0] = -0x60;
  local_38[1] = '8';
  local_38[2] = ';';
  local_38[3] = 'y';
  local_38[4] = '\x14';
  local_38[5] = 'G';
  local_38[6] = 'U';
  local_38[7] = '@';
  local_40 = 85.1106;
  predicate_26.absolute = 2.2250738585072014e-308;
  predicate_26.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","85.1106","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xba,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_26);
  local_38[0] = '2';
  local_38[1] = 'M';
  local_38[2] = '\n';
  local_38[3] = '6';
  local_38[4] = 'G';
  local_38[5] = -0xd;
  local_38[6] = 'S';
  local_38[7] = '@';
  local_40 = 79.8012;
  predicate_27.absolute = 2.2250738585072014e-308;
  predicate_27.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","79.8012","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xbc,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_27);
  local_38[0] = -100;
  local_38[1] = -0x53;
  local_38[2] = '(';
  local_38[3] = '\x06';
  local_38[4] = '[';
  local_38[5] = -0x3f;
  local_38[6] = 'R';
  local_38[7] = '@';
  local_40 = 75.0212;
  predicate_28.absolute = 2.2250738585072014e-308;
  predicate_28.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","75.0212","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xbe,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_28);
  local_38[0] = -0x44;
  local_38[1] = 'j';
  local_38[2] = -0x4a;
  local_38[3] = 's';
  local_38[4] = 'z';
  local_38[5] = -0x5f;
  local_38[6] = 'Q';
  local_38[7] = '@';
  local_40 = 70.5231;
  predicate_29.absolute = 2.2250738585072014e-308;
  predicate_29.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","70.5231","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc0,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_29);
  local_38[0] = 'f';
  local_38[1] = -0x49;
  local_38[2] = '\x18';
  local_38[3] = -0x60;
  local_38[4] = -0x72;
  local_38[5] = -99;
  local_38[6] = 'P';
  local_38[7] = '@';
  local_40 = 66.4618;
  predicate_30.absolute = 2.2250738585072014e-308;
  predicate_30.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","66.4618","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc2,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_30);
  local_38[0] = -0x5f;
  local_38[1] = '\x1d';
  local_38[2] = -0x55;
  local_38[3] = -0xc;
  local_38[4] = -0x68;
  local_38[5] = 'N';
  local_38[6] = 'O';
  local_38[7] = '@';
  local_40 = 62.614;
  predicate_31.absolute = 2.2250738585072014e-308;
  predicate_31.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","62.614","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc4,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_31);
  local_38[0] = 'x';
  local_38[1] = 'p';
  local_38[2] = '\x1f';
  local_38[3] = -0x4e;
  local_38[4] = -0x11;
  local_38[5] = -0x70;
  local_38[6] = 'M';
  local_38[7] = '@';
  local_40 = 59.1323;
  predicate_32.absolute = 2.2250738585072014e-308;
  predicate_32.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","59.1323","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc6,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_32);
  local_38[0] = 'L';
  local_38[1] = -0x19;
  local_38[2] = 'B';
  local_38[3] = -0x32;
  local_38[4] = '\x03';
  local_38[5] = -0x18;
  local_38[6] = 'K';
  local_38[7] = '@';
  local_40 = 55.8126;
  predicate_33.absolute = 2.2250738585072014e-308;
  predicate_33.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","55.8126","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xc8,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_33);
  local_38[0] = '5';
  local_38[1] = -0x4a;
  local_38[2] = 'k';
  local_38[3] = 'A';
  local_38[4] = -0x19;
  local_38[5] = 'f';
  local_38[6] = 'J';
  local_38[7] = '@';
  local_40 = 52.8039;
  predicate_34.absolute = 2.2250738585072014e-308;
  predicate_34.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","52.8039","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xca,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_34);
  local_38[0] = -0x46;
  local_38[1] = -0x67;
  local_38[2] = -0x36;
  local_38[3] = 'Q';
  local_38[4] = -0x7d;
  local_38[5] = -0xb;
  local_38[6] = 'H';
  local_38[7] = '@';
  local_40 = 49.9181;
  predicate_35.absolute = 2.2250738585072014e-308;
  predicate_35.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","49.9181","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xcc,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_35);
  local_38[0] = -0x13;
  local_38[1] = '$';
  local_38[2] = 'j';
  local_38[3] = 'x';
  local_38[4] = ']';
  local_38[5] = -0x5a;
  local_38[6] = 'G';
  local_38[7] = '@';
  local_40 = 47.2997;
  predicate_36.absolute = 2.2250738585072014e-308;
  predicate_36.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.value()","47.2997","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/trend_suite.cpp"
             ,(char *)0xce,0x1051ad,local_38,&local_40,in_stack_ffffffffffffffb8,predicate_36);
  return;
}

Assistant:

void test_alternating()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::trend<double> filter;

    // Converge towards 1.5

    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.0, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 2.0, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.44444, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.83333, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.50667, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.75556, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.52517, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.70952, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53192, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.67873, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53438, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.65652, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53501, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.63965, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53479, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.62636, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53415, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.61559, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 1.53333, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 1.60666, tolerance);

    // Outlier

    filter.push(1000.0);
    TRIAL_TEST_WITH(filter.value(), 139.716, tolerance);

    // Slow recovery

    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 129.374, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 119.974, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 111.631, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 103.971, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 97.1314, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 90.7946, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 85.1106, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 79.8012, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 75.0212, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 70.5231, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 66.4618, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 62.614, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 59.1323, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 55.8126, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 52.8039, tolerance);
    filter.push(1.0);
    TRIAL_TEST_WITH(filter.value(), 49.9181, tolerance);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.value(), 47.2997, tolerance);
}